

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t iconv_strncat_in_locale(archive_string *as,void *_p,size_t length,archive_string_conv *sc)

{
  archive_string *paVar1;
  size_t sVar2;
  int *piVar3;
  ulong local_80;
  size_t rbytes;
  size_t result;
  int local_68;
  wchar_t from_size;
  wchar_t to_size;
  wchar_t return_value;
  size_t bs;
  size_t avail;
  char *outp;
  iconv_t cd;
  size_t remaining;
  char *itp;
  archive_string_conv *sc_local;
  size_t length_local;
  void *_p_local;
  archive_string *as_local;
  
  from_size = L'\0';
  if ((sc->flag & 0x1400U) == 0) {
    local_68 = 1;
  }
  else {
    local_68 = 2;
  }
  if ((sc->flag & 0x2800U) == 0) {
    result._4_4_ = 1;
  }
  else {
    result._4_4_ = 2;
  }
  itp = (char *)sc;
  sc_local = (archive_string_conv *)length;
  length_local = (size_t)_p;
  _p_local = as;
  paVar1 = archive_string_ensure(as,as->length + length * 2 + (long)local_68);
  if (paVar1 == (archive_string *)0x0) {
    as_local._4_4_ = L'\xffffffff';
  }
  else {
    outp = *(char **)(itp + 0x28);
    remaining = length_local;
    cd = sc_local;
    avail = *_p_local + *(long *)((long)_p_local + 8);
    bs = (*(long *)((long)_p_local + 0x10) - *(long *)((long)_p_local + 8)) - (long)local_68;
    while (((iconv_t)(long)result._4_4_ <= cd &&
           (sVar2 = iconv(outp,(char **)&remaining,(size_t *)&cd,(char **)&avail,&bs),
           sVar2 == 0xffffffffffffffff))) {
      piVar3 = __errno_location();
      if ((*piVar3 == 0x54) || (piVar3 = __errno_location(), *piVar3 == 0x16)) {
        if ((*(uint *)(itp + 0x24) & 0x1500) == 0) {
          *(undefined1 *)avail = 0x3f;
          bs = bs - 1;
          avail = avail + 1;
        }
        else {
          if ((*(uint *)(itp + 0x24) & 0x100) == 0) {
            local_80 = 2;
          }
          else {
            local_80 = 3;
          }
          if (bs < local_80) {
            *(size_t *)((long)_p_local + 8) = avail - *_p_local;
            paVar1 = archive_string_ensure
                               ((archive_string *)_p_local,
                                *(long *)((long)_p_local + 0x10) + (long)cd * (long)local_68 +
                                local_80);
            if (paVar1 == (archive_string *)0x0) {
              return L'\xffffffff';
            }
            avail = *_p_local + *(long *)((long)_p_local + 8);
            bs = (*(long *)((long)_p_local + 0x10) - *(long *)((long)_p_local + 8)) - (long)local_68
            ;
          }
          if ((*(uint *)(itp + 0x24) & 0x100) == 0) {
            if ((*(uint *)(itp + 0x24) & 0x400) == 0) {
              archive_le16enc((void *)avail,0xfffd);
            }
            else {
              archive_be16enc((void *)avail,0xfffd);
            }
          }
          else {
            *(undefined2 *)avail = 0xbfef;
            *(undefined1 *)(avail + 2) = 0xbd;
          }
          bs = bs - local_80;
          avail = local_80 + avail;
        }
        remaining = remaining + (long)result._4_4_;
        cd = (iconv_t)((long)cd - (long)result._4_4_);
        from_size = L'\xffffffff';
      }
      else {
        *(size_t *)((long)_p_local + 8) = avail - *_p_local;
        paVar1 = archive_string_ensure
                           ((archive_string *)_p_local,
                            *(long *)((long)_p_local + 0x10) + (long)cd * 2);
        if (paVar1 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        avail = *_p_local + *(long *)((long)_p_local + 8);
        bs = (*(long *)((long)_p_local + 0x10) - *(long *)((long)_p_local + 8)) - (long)local_68;
      }
    }
    *(size_t *)((long)_p_local + 8) = avail - *_p_local;
    *(undefined1 *)(*_p_local + *(long *)((long)_p_local + 8)) = 0;
    if (local_68 == 2) {
      *(undefined1 *)(*_p_local + 1 + *(long *)((long)_p_local + 8)) = 0;
    }
    as_local._4_4_ = from_size;
  }
  return as_local._4_4_;
}

Assistant:

static int
iconv_strncat_in_locale(struct archive_string *as, const void *_p,
    size_t length, struct archive_string_conv *sc)
{
	ICONV_CONST char *itp;
	size_t remaining;
	iconv_t cd;
	char *outp;
	size_t avail, bs;
	int return_value = 0; /* success */
	int to_size, from_size;

	if (sc->flag & SCONV_TO_UTF16)
		to_size = 2;
	else
		to_size = 1;
	if (sc->flag & SCONV_FROM_UTF16)
		from_size = 2;
	else
		from_size = 1;

	if (archive_string_ensure(as, as->length + length*2+to_size) == NULL)
		return (-1);

	cd = sc->cd;
	itp = (char *)(uintptr_t)_p;
	remaining = length;
	outp = as->s + as->length;
	avail = as->buffer_length - as->length - to_size;
	while (remaining >= (size_t)from_size) {
		size_t result = iconv(cd, &itp, &remaining, &outp, &avail);

		if (result != (size_t)-1)
			break; /* Conversion completed. */

		if (errno == EILSEQ || errno == EINVAL) {
			/*
		 	 * If an output charset is UTF-8 or UTF-16BE/LE,
			 * unknown character should be U+FFFD
			 * (replacement character).
			 */
			if (sc->flag & (SCONV_TO_UTF8 | SCONV_TO_UTF16)) {
				size_t rbytes;
				if (sc->flag & SCONV_TO_UTF8)
					rbytes = sizeof(utf8_replacement_char);
				else
					rbytes = 2;

				if (avail < rbytes) {
					as->length = outp - as->s;
					bs = as->buffer_length +
					    (remaining * to_size) + rbytes;
					if (NULL ==
					    archive_string_ensure(as, bs))
						return (-1);
					outp = as->s + as->length;
					avail = as->buffer_length
					    - as->length - to_size;
				}
				if (sc->flag & SCONV_TO_UTF8)
					memcpy(outp, utf8_replacement_char, sizeof(utf8_replacement_char));
				else if (sc->flag & SCONV_TO_UTF16BE)
					archive_be16enc(outp, UNICODE_R_CHAR);
				else
					archive_le16enc(outp, UNICODE_R_CHAR);
				outp += rbytes;
				avail -= rbytes;
			} else {
				/* Skip the illegal input bytes. */
				*outp++ = '?';
				avail--;
			}
			itp += from_size;
			remaining -= from_size;
			return_value = -1; /* failure */
		} else {
			/* E2BIG no output buffer,
			 * Increase an output buffer.  */
			as->length = outp - as->s;
			bs = as->buffer_length + remaining * 2;
			if (NULL == archive_string_ensure(as, bs))
				return (-1);
			outp = as->s + as->length;
			avail = as->buffer_length - as->length - to_size;
		}
	}
	as->length = outp - as->s;
	as->s[as->length] = 0;
	if (to_size == 2)
		as->s[as->length+1] = 0;
	return (return_value);
}